

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

CURLcode brotli_do_write(Curl_easy *data,Curl_cwriter *writer,int type,char *buf,size_t nbytes)

{
  BrotliDecoderErrorCode be;
  bool bVar1;
  int local_60;
  CURLcode local_5c;
  BrotliDecoderResult r;
  CURLcode result;
  size_t dstleft;
  uint8_t *dst;
  uint8_t *src;
  brotli_writer *bp;
  size_t nbytes_local;
  char *buf_local;
  Curl_cwriter *pCStack_20;
  int type_local;
  Curl_cwriter *writer_local;
  Curl_easy *data_local;
  
  local_5c = CURLE_OK;
  local_60 = 3;
  dst = (uint8_t *)buf;
  src = (uint8_t *)writer;
  bp = (brotli_writer *)nbytes;
  nbytes_local = (size_t)buf;
  buf_local._4_4_ = type;
  pCStack_20 = writer;
  writer_local = (Curl_cwriter *)data;
  if (((type & 1U) == 0) || (nbytes == 0)) {
    data_local._4_4_ = Curl_cwriter_write(data,writer->next,type,buf,nbytes);
  }
  else if (writer[0x201].cwt == (Curl_cwtype *)0x0) {
    data_local._4_4_ = CURLE_WRITE_ERROR;
  }
  else {
    while( true ) {
      if ((bp != (brotli_writer *)0x0) || (bVar1 = false, local_60 == 3)) {
        bVar1 = local_5c == CURLE_OK;
      }
      if (!bVar1) break;
      dstleft = (size_t)(src + 0x20);
      _r = 0x4000;
      local_60 = BrotliDecoderDecompressStream(*(undefined8 *)(src + 0x4020),&bp,&dst,&r,&dstleft,0)
      ;
      local_5c = Curl_cwriter_write((Curl_easy *)writer_local,pCStack_20->next,buf_local._4_4_,
                                    (char *)(src + 0x20),0x4000 - _r);
      if (local_5c != CURLE_OK) break;
      if (local_60 == 1) {
        BrotliDecoderDestroyInstance(*(undefined8 *)(src + 0x4020));
        src[0x4020] = '\0';
        src[0x4021] = '\0';
        src[0x4022] = '\0';
        src[0x4023] = '\0';
        src[0x4024] = '\0';
        src[0x4025] = '\0';
        src[0x4026] = '\0';
        src[0x4027] = '\0';
        if (bp != (brotli_writer *)0x0) {
          local_5c = CURLE_WRITE_ERROR;
        }
      }
      else if (local_60 != 2 && local_60 != 3) {
        be = BrotliDecoderGetErrorCode(*(undefined8 *)(src + 0x4020));
        local_5c = brotli_map_error(be);
      }
    }
    data_local._4_4_ = local_5c;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode brotli_do_write(struct Curl_easy *data,
                                struct Curl_cwriter *writer, int type,
                                const char *buf, size_t nbytes)
{
  struct brotli_writer *bp = (struct brotli_writer *) writer;
  const uint8_t *src = (const uint8_t *) buf;
  uint8_t *dst;
  size_t dstleft;
  CURLcode result = CURLE_OK;
  BrotliDecoderResult r = BROTLI_DECODER_RESULT_NEEDS_MORE_OUTPUT;

  if(!(type & CLIENTWRITE_BODY) || !nbytes)
    return Curl_cwriter_write(data, writer->next, type, buf, nbytes);

  if(!bp->br)
    return CURLE_WRITE_ERROR;  /* Stream already ended. */

  while((nbytes || r == BROTLI_DECODER_RESULT_NEEDS_MORE_OUTPUT) &&
        result == CURLE_OK) {
    dst = (uint8_t *) bp->buffer;
    dstleft = DECOMPRESS_BUFFER_SIZE;
    r = BrotliDecoderDecompressStream(bp->br,
                                      &nbytes, &src, &dstleft, &dst, NULL);
    result = Curl_cwriter_write(data, writer->next, type,
                                bp->buffer, DECOMPRESS_BUFFER_SIZE - dstleft);
    if(result)
      break;
    switch(r) {
    case BROTLI_DECODER_RESULT_NEEDS_MORE_OUTPUT:
    case BROTLI_DECODER_RESULT_NEEDS_MORE_INPUT:
      break;
    case BROTLI_DECODER_RESULT_SUCCESS:
      BrotliDecoderDestroyInstance(bp->br);
      bp->br = NULL;
      if(nbytes)
        result = CURLE_WRITE_ERROR;
      break;
    default:
      result = brotli_map_error(BrotliDecoderGetErrorCode(bp->br));
      break;
    }
  }
  return result;
}